

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_tec(REF_CAVITY ref_cavity,char *filename)

{
  REF_INT RVar1;
  int iVar2;
  REF_CELL pRVar3;
  uint uVar4;
  FILE *__stream;
  REF_STATUS ref_private_macro_code_rss_35;
  REF_STATUS ref_private_macro_code_rss_34;
  REF_STATUS ref_private_macro_code_rss_33;
  REF_STATUS ref_private_macro_code_rss_32;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  FILE *f;
  char *zonetype;
  REF_DBL xyz_phys [3];
  REF_INT local;
  REF_INT item;
  REF_INT nodes [27];
  int local_60;
  REF_INT cell_node;
  REF_INT cell;
  REF_INT seg_node;
  REF_INT seg;
  REF_INT face_node;
  REF_INT face;
  REF_CELL ref_cell;
  REF_DICT face_dict;
  REF_DICT node_dict;
  REF_GRID pRStack_28;
  REF_INT node;
  REF_GRID ref_grid;
  char *filename_local;
  REF_CAVITY ref_cavity_local;
  
  pRStack_28 = ref_cavity->ref_grid;
  node_dict._4_4_ = ref_cavity->node;
  ref_grid = (REF_GRID)filename;
  filename_local = (char *)ref_cavity;
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    printf("unable to open %s\n",ref_grid);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x837,
           "ref_cavity_tec","unable to open file");
    ref_cavity_local._4_4_ = 2;
  }
  else {
    fprintf(__stream,"title=\"tecplot refine cavity\"\n");
    fprintf(__stream,"variables = \"x\" \"y\" \"z\" \"i\"\n");
    uVar4 = ref_dict_create(&face_dict);
    if (uVar4 == 0) {
      uVar4 = ref_dict_create((REF_DICT *)&ref_cell);
      if (uVar4 == 0) {
        pRVar3 = pRStack_28->cell[8];
        for (xyz_phys[2]._4_4_ = 0; xyz_phys[2]._4_4_ < **(int **)(filename_local + 0x50);
            xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
          RVar1 = *(REF_INT *)
                   (*(long *)(*(long *)(filename_local + 0x50) + 8) + (long)xyz_phys[2]._4_4_ * 4);
          uVar4 = ref_dict_store((REF_DICT)ref_cell,RVar1,0);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x842,"ref_cavity_tec",(ulong)uVar4,"store");
            return uVar4;
          }
          uVar4 = ref_cell_nodes(pRVar3,RVar1,&local);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x843,"ref_cavity_tec",(ulong)uVar4,"nodes");
            return uVar4;
          }
          for (local_60 = 0; local_60 < pRVar3->node_per; local_60 = local_60 + 1) {
            uVar4 = ref_dict_store(face_dict,(&local)[local_60],0);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x845,"ref_cavity_tec",(ulong)uVar4,"store");
              return uVar4;
            }
          }
        }
        if ((0 < face_dict->n) && (0 < (int)ref_cell->type)) {
          fprintf(__stream,
                  "zone t=\"old-tet\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                  (ulong)(uint)face_dict->n,(ulong)ref_cell->type,"point","fetetrahedron");
          for (xyz_phys[2]._4_4_ = 0; xyz_phys[2]._4_4_ < face_dict->n;
              xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
            xyz_phys[2]._0_4_ = face_dict->key[xyz_phys[2]._4_4_];
            xyz_phys[0] = pRStack_28->node->real[(int)(xyz_phys[2]._0_4_ * 0xf + 1)];
            xyz_phys[1] = pRStack_28->node->real[(int)(xyz_phys[2]._0_4_ * 0xf + 2)];
            fprintf(__stream," %.16e %.16e %.16e %d\n",
                    pRStack_28->node->real[(int)(xyz_phys[2]._0_4_ * 0xf)],xyz_phys[0],xyz_phys[1],
                    (ulong)xyz_phys[2]._0_4_);
          }
          for (xyz_phys[2]._4_4_ = 0; xyz_phys[2]._4_4_ < (int)ref_cell->type;
              xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
            uVar4 = ref_cell_nodes(pRVar3,*(REF_INT *)
                                           (*(long *)&ref_cell->edge_per +
                                           (long)xyz_phys[2]._4_4_ * 4),&local);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x859,"ref_cavity_tec",(ulong)uVar4,"nodes");
              return uVar4;
            }
            for (local_60 = 0; local_60 < pRVar3->node_per; local_60 = local_60 + 1) {
              uVar4 = ref_dict_location(face_dict,(&local)[local_60],(REF_INT *)(xyz_phys + 2));
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x85b,"ref_cavity_tec",(ulong)uVar4,"ret");
                return uVar4;
              }
              fprintf(__stream," %d",(ulong)(xyz_phys[2]._0_4_ + 1));
            }
            fprintf(__stream,"\n");
          }
        }
        uVar4 = ref_dict_free((REF_DICT)ref_cell);
        if (uVar4 == 0) {
          uVar4 = ref_dict_free(face_dict);
          if (uVar4 == 0) {
            uVar4 = ref_dict_create(&face_dict);
            if (uVar4 == 0) {
              uVar4 = ref_dict_create((REF_DICT *)&ref_cell);
              if (uVar4 == 0) {
                uVar4 = ref_dict_store(face_dict,node_dict._4_4_,0);
                if (uVar4 == 0) {
                  for (seg = 0; seg < *(int *)(filename_local + 0x34); seg = seg + 1) {
                    if (((-1 < seg) && (seg < *(int *)(filename_local + 0x34))) &&
                       (*(int *)(*(long *)(filename_local + 0x40) + (long)(seg * 3) * 4) != -1)) {
                      uVar4 = ref_dict_store((REF_DICT)ref_cell,seg,0);
                      if (uVar4 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x869,"ref_cavity_tec",(ulong)uVar4,"store");
                        return uVar4;
                      }
                      for (seg_node = 0; seg_node < 3; seg_node = seg_node + 1) {
                        uVar4 = ref_dict_store(face_dict,
                                               *(REF_INT *)
                                                (*(long *)(filename_local + 0x40) +
                                                (long)(seg_node + seg * 3) * 4),0);
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0x86d,"ref_cavity_tec",(ulong)uVar4,"store");
                          return uVar4;
                        }
                      }
                    }
                  }
                  if ((0 < face_dict->n) && (0 < (int)ref_cell->type)) {
                    fprintf(__stream,
                            "zone t=\"new-tet\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                            ,(ulong)(uint)face_dict->n,(ulong)ref_cell->type,"point","fetetrahedron"
                           );
                    for (xyz_phys[2]._4_4_ = 0; xyz_phys[2]._4_4_ < face_dict->n;
                        xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
                      xyz_phys[2]._0_4_ = face_dict->key[xyz_phys[2]._4_4_];
                      xyz_phys[0] = pRStack_28->node->real[(int)(xyz_phys[2]._0_4_ * 0xf + 1)];
                      xyz_phys[1] = pRStack_28->node->real[(int)(xyz_phys[2]._0_4_ * 0xf + 2)];
                      fprintf(__stream," %.16e %.16e %.16e %d\n",
                              pRStack_28->node->real[(int)(xyz_phys[2]._0_4_ * 0xf)],xyz_phys[0],
                              xyz_phys[1],(ulong)xyz_phys[2]._0_4_);
                    }
                    for (xyz_phys[2]._4_4_ = 0; xyz_phys[2]._4_4_ < (int)ref_cell->type;
                        xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
                      iVar2 = *(int *)(*(long *)&ref_cell->edge_per + (long)xyz_phys[2]._4_4_ * 4);
                      uVar4 = ref_dict_location(face_dict,node_dict._4_4_,(REF_INT *)(xyz_phys + 2))
                      ;
                      if (uVar4 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x881,"ref_cavity_tec",(ulong)uVar4,"center node");
                        return uVar4;
                      }
                      fprintf(__stream," %d",(ulong)(xyz_phys[2]._0_4_ + 1));
                      for (seg_node = 0; seg_node < 3; seg_node = seg_node + 1) {
                        uVar4 = ref_dict_location(face_dict,
                                                  *(REF_INT *)
                                                   (*(long *)(filename_local + 0x40) +
                                                   (long)(seg_node + iVar2 * 3) * 4),
                                                  (REF_INT *)(xyz_phys + 2));
                        if (uVar4 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0x886,"ref_cavity_tec",(ulong)uVar4,"ret");
                          return uVar4;
                        }
                        fprintf(__stream," %d",(ulong)(xyz_phys[2]._0_4_ + 1));
                      }
                      fprintf(__stream,"\n");
                    }
                  }
                  uVar4 = ref_dict_free((REF_DICT)ref_cell);
                  if (uVar4 == 0) {
                    uVar4 = ref_dict_free(face_dict);
                    if (uVar4 == 0) {
                      uVar4 = ref_dict_create(&face_dict);
                      if (uVar4 == 0) {
                        uVar4 = ref_dict_create((REF_DICT *)&ref_cell);
                        if (uVar4 == 0) {
                          pRVar3 = pRStack_28->cell[3];
                          for (xyz_phys[2]._4_4_ = 0;
                              xyz_phys[2]._4_4_ < **(int **)(filename_local + 0x48);
                              xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
                            RVar1 = *(REF_INT *)
                                     (*(long *)(*(long *)(filename_local + 0x48) + 8) +
                                     (long)xyz_phys[2]._4_4_ * 4);
                            uVar4 = ref_dict_store((REF_DICT)ref_cell,RVar1,0);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x898,"ref_cavity_tec",(ulong)uVar4,"store");
                              return uVar4;
                            }
                            uVar4 = ref_cell_nodes(pRVar3,RVar1,&local);
                            if (uVar4 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x899,"ref_cavity_tec",(ulong)uVar4,"nodes");
                              return uVar4;
                            }
                            for (local_60 = 0; local_60 < pRVar3->node_per; local_60 = local_60 + 1)
                            {
                              uVar4 = ref_dict_store(face_dict,(&local)[local_60],0);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0x89b,"ref_cavity_tec",(ulong)uVar4,"store");
                                return uVar4;
                              }
                            }
                          }
                          if ((0 < face_dict->n) && (0 < (int)ref_cell->type)) {
                            fprintf(__stream,
                                    "zone t=\"old-tri\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                    ,(ulong)(uint)face_dict->n,(ulong)ref_cell->type,"point",
                                    "fetriangle");
                            for (xyz_phys[2]._4_4_ = 0; xyz_phys[2]._4_4_ < face_dict->n;
                                xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
                              xyz_phys[2]._0_4_ = face_dict->key[xyz_phys[2]._4_4_];
                              xyz_phys[0] = pRStack_28->node->real
                                            [(int)(xyz_phys[2]._0_4_ * 0xf + 1)];
                              xyz_phys[1] = pRStack_28->node->real
                                            [(int)(xyz_phys[2]._0_4_ * 0xf + 2)];
                              fprintf(__stream," %.16e %.16e %.16e %d\n",
                                      pRStack_28->node->real[(int)(xyz_phys[2]._0_4_ * 0xf)],
                                      xyz_phys[0],xyz_phys[1],(ulong)xyz_phys[2]._0_4_);
                            }
                            for (xyz_phys[2]._4_4_ = 0; xyz_phys[2]._4_4_ < (int)ref_cell->type;
                                xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
                              uVar4 = ref_cell_nodes(pRVar3,*(REF_INT *)
                                                             (*(long *)&ref_cell->edge_per +
                                                             (long)xyz_phys[2]._4_4_ * 4),&local);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0x8af,"ref_cavity_tec",(ulong)uVar4,"nodes");
                                return uVar4;
                              }
                              for (local_60 = 0; local_60 < pRVar3->node_per;
                                  local_60 = local_60 + 1) {
                                uVar4 = ref_dict_location(face_dict,(&local)[local_60],
                                                          (REF_INT *)(xyz_phys + 2));
                                if (uVar4 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                         ,0x8b1,"ref_cavity_tec",(ulong)uVar4,"ret");
                                  return uVar4;
                                }
                                fprintf(__stream," %d",(ulong)(xyz_phys[2]._0_4_ + 1));
                              }
                              fprintf(__stream,"\n");
                            }
                          }
                          uVar4 = ref_dict_free((REF_DICT)ref_cell);
                          if (uVar4 == 0) {
                            uVar4 = ref_dict_free(face_dict);
                            if (uVar4 == 0) {
                              uVar4 = ref_dict_create(&face_dict);
                              if (uVar4 == 0) {
                                uVar4 = ref_dict_create((REF_DICT *)&ref_cell);
                                if (uVar4 == 0) {
                                  uVar4 = ref_dict_store(face_dict,node_dict._4_4_,0);
                                  if (uVar4 == 0) {
                                    for (seg = 0; seg < *(int *)(filename_local + 0x1c);
                                        seg = seg + 1) {
                                      if (((-1 < seg) && (seg < *(int *)(filename_local + 0x1c))) &&
                                         (*(int *)(*(long *)(filename_local + 0x28) +
                                                  (long)(seg * 3) * 4) != -1)) {
                                        uVar4 = ref_dict_store((REF_DICT)ref_cell,seg,0);
                                        if (uVar4 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                                 ,0x8bf,"ref_cavity_tec",(ulong)uVar4,"store");
                                          return uVar4;
                                        }
                                        for (cell_node = 0; cell_node < 2; cell_node = cell_node + 1
                                            ) {
                                          uVar4 = ref_dict_store(face_dict,
                                                                 *(REF_INT *)
                                                                  (*(long *)(filename_local + 0x28)
                                                                  + (long)(cell_node + seg * 3) * 4)
                                                                 ,0);
                                          if (uVar4 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                                  ,0x8c3,"ref_cavity_tec",(ulong)uVar4,"store");
                                            return uVar4;
                                          }
                                        }
                                      }
                                    }
                                    if ((0 < face_dict->n) && (0 < (int)ref_cell->type)) {
                                      fprintf(__stream,
                                              "zone t=\"new-tri\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n"
                                              ,(ulong)(uint)face_dict->n,(ulong)ref_cell->type,
                                              "point","fetriangle");
                                      for (xyz_phys[2]._4_4_ = 0; xyz_phys[2]._4_4_ < face_dict->n;
                                          xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
                                        xyz_phys[2]._0_4_ = face_dict->key[xyz_phys[2]._4_4_];
                                        xyz_phys[0] = pRStack_28->node->real
                                                      [(int)(xyz_phys[2]._0_4_ * 0xf + 1)];
                                        xyz_phys[1] = pRStack_28->node->real
                                                      [(int)(xyz_phys[2]._0_4_ * 0xf + 2)];
                                        fprintf(__stream," %.16e %.16e %.16e %d\n",
                                                pRStack_28->node->real
                                                [(int)(xyz_phys[2]._0_4_ * 0xf)],xyz_phys[0],
                                                xyz_phys[1],(ulong)xyz_phys[2]._0_4_);
                                      }
                                      for (xyz_phys[2]._4_4_ = 0;
                                          xyz_phys[2]._4_4_ < (int)ref_cell->type;
                                          xyz_phys[2]._4_4_ = xyz_phys[2]._4_4_ + 1) {
                                        iVar2 = *(int *)(*(long *)&ref_cell->edge_per +
                                                        (long)xyz_phys[2]._4_4_ * 4);
                                        uVar4 = ref_dict_location(face_dict,node_dict._4_4_,
                                                                  (REF_INT *)(xyz_phys + 2));
                                        if (uVar4 != 0) {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                                 ,0x8d7,"ref_cavity_tec",(ulong)uVar4,"center node")
                                          ;
                                          return uVar4;
                                        }
                                        fprintf(__stream," %d",(ulong)(xyz_phys[2]._0_4_ + 1));
                                        for (cell_node = 0; cell_node < 2; cell_node = cell_node + 1
                                            ) {
                                          uVar4 = ref_dict_location(face_dict,
                                                                    *(REF_INT *)
                                                                     (*(long *)(filename_local +
                                                                               0x28) +
                                                                     (long)(cell_node + iVar2 * 3) *
                                                                     4),(REF_INT *)(xyz_phys + 2));
                                          if (uVar4 != 0) {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                                  ,0x8dc,"ref_cavity_tec",(ulong)uVar4,"ret");
                                            return uVar4;
                                          }
                                          fprintf(__stream," %d",(ulong)(xyz_phys[2]._0_4_ + 1));
                                        }
                                        fprintf(__stream,"\n");
                                      }
                                    }
                                    uVar4 = ref_dict_free((REF_DICT)ref_cell);
                                    if (uVar4 == 0) {
                                      uVar4 = ref_dict_free(face_dict);
                                      if (uVar4 == 0) {
                                        fclose(__stream);
                                        ref_cavity_local._4_4_ = 0;
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                               ,0x8e4,"ref_cavity_tec",(ulong)uVar4,"free nodes");
                                        ref_cavity_local._4_4_ = uVar4;
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                             ,0x8e3,"ref_cavity_tec",(ulong)uVar4,"free face");
                                      ref_cavity_local._4_4_ = uVar4;
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                           ,0x8bd,"ref_cavity_tec",(ulong)uVar4,"store");
                                    ref_cavity_local._4_4_ = uVar4;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                         ,0x8bb,"ref_cavity_tec",(ulong)uVar4,"create faces");
                                  ref_cavity_local._4_4_ = uVar4;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                       ,0x8ba,"ref_cavity_tec",(ulong)uVar4,"create nodes");
                                ref_cavity_local._4_4_ = uVar4;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                     ,0x8b8,"ref_cavity_tec",(ulong)uVar4,"free nodes");
                              ref_cavity_local._4_4_ = uVar4;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x8b7,"ref_cavity_tec",(ulong)uVar4,"free tris");
                            ref_cavity_local._4_4_ = uVar4;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                 ,0x893,"ref_cavity_tec",(ulong)uVar4,"create faces");
                          ref_cavity_local._4_4_ = uVar4;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x892,"ref_cavity_tec",(ulong)uVar4,"create nodes");
                        ref_cavity_local._4_4_ = uVar4;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                             ,0x88e,"ref_cavity_tec",(ulong)uVar4,"free nodes");
                      ref_cavity_local._4_4_ = uVar4;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x88d,"ref_cavity_tec",(ulong)uVar4,"free face");
                    ref_cavity_local._4_4_ = uVar4;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x867,"ref_cavity_tec",(ulong)uVar4,"store");
                  ref_cavity_local._4_4_ = uVar4;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x865,"ref_cavity_tec",(ulong)uVar4,"create faces");
                ref_cavity_local._4_4_ = uVar4;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x864,"ref_cavity_tec",(ulong)uVar4,"create nodes");
              ref_cavity_local._4_4_ = uVar4;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x862,"ref_cavity_tec",(ulong)uVar4,"free nodes");
            ref_cavity_local._4_4_ = uVar4;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x861,"ref_cavity_tec",(ulong)uVar4,"free tris");
          ref_cavity_local._4_4_ = uVar4;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x83d,"ref_cavity_tec",(ulong)uVar4,"create faces");
        ref_cavity_local._4_4_ = uVar4;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x83c,"ref_cavity_tec",(ulong)uVar4,"create nodes");
      ref_cavity_local._4_4_ = uVar4;
    }
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_tec(REF_CAVITY ref_cavity, const char *filename) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_DICT node_dict, face_dict;
  REF_CELL ref_cell;
  REF_INT face, face_node, seg, seg_node;
  REF_INT cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, local;
  REF_DBL xyz_phys[3];
  const char *zonetype;
  FILE *f;

  zonetype = "fetetrahedron";

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine cavity\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"i\"\n");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_dict_store(face_dict, cell, 0), "store");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"old-tet\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      cell = ref_dict_key(face_dict, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }
  RSS(ref_dict_free(face_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  RSS(ref_dict_store(node_dict, node, 0), "store");
  each_ref_cavity_valid_face(ref_cavity, face) {
    RSS(ref_dict_store(face_dict, face, 0), "store");
    each_ref_cavity_face_node(ref_cavity, face_node) {
      RSS(ref_dict_store(node_dict, ref_cavity_f2n(ref_cavity, face_node, face),
                         0),
          "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"new-tet\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      face = ref_dict_key(face_dict, item);
      RSS(ref_dict_location(node_dict, node, &local), "center node");
      fprintf(f, " %d", local + 1);
      each_ref_cavity_face_node(ref_cavity, face_node) {
        RSS(ref_dict_location(
                node_dict, ref_cavity_f2n(ref_cavity, face_node, face), &local),
            "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }

  RSS(ref_dict_free(face_dict), "free face");
  RSS(ref_dict_free(node_dict), "free nodes");

  zonetype = "fetriangle";

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_dict_store(face_dict, cell, 0), "store");
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"old-tri\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      cell = ref_dict_key(face_dict, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
      each_ref_cell_cell_node(ref_cell, cell_node) {
        RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }
  RSS(ref_dict_free(face_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&face_dict), "create faces");

  RSS(ref_dict_store(node_dict, node, 0), "store");
  each_ref_cavity_valid_seg(ref_cavity, face) {
    RSS(ref_dict_store(face_dict, face, 0), "store");
    each_ref_cavity_seg_node(ref_cavity, seg_node) {
      RSS(ref_dict_store(node_dict, ref_cavity_s2n(ref_cavity, seg_node, face),
                         0),
          "store");
    }
  }

  if (0 < ref_dict_n(node_dict) && 0 < ref_dict_n(face_dict)) {
    fprintf(f,
            "zone t=\"new-tri\", nodes=%d, elements=%d, datapacking=%s, "
            "zonetype=%s\n",
            ref_dict_n(node_dict), ref_dict_n(face_dict), "point", zonetype);
    for (item = 0; item < ref_dict_n(node_dict); item++) {
      local = ref_dict_key(node_dict, item);
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      fprintf(f, " %.16e %.16e %.16e %d\n", xyz_phys[0], xyz_phys[1],
              xyz_phys[2], local);
    }

    for (item = 0; item < ref_dict_n(face_dict); item++) {
      seg = ref_dict_key(face_dict, item);
      RSS(ref_dict_location(node_dict, node, &local), "center node");
      fprintf(f, " %d", local + 1);
      each_ref_cavity_seg_node(ref_cavity, seg_node) {
        RSS(ref_dict_location(
                node_dict, ref_cavity_s2n(ref_cavity, seg_node, seg), &local),
            "ret");
        fprintf(f, " %d", local + 1);
      }
      fprintf(f, "\n");
    }
  }

  RSS(ref_dict_free(face_dict), "free face");
  RSS(ref_dict_free(node_dict), "free nodes");
  fclose(f);

  return REF_SUCCESS;
}